

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

bool __thiscall absl::lts_20250127::Mutex::TryLock(Mutex *this)

{
  ulong uVar1;
  GraphId id;
  SynchLocksHeld *held_locks;
  bool bVar2;
  
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  if ((uVar1 & 0x19) == 0) {
    LOCK();
    bVar2 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar2) {
      (this->mu_).super___atomic_base<long>._M_i = uVar1 | 8;
    }
    UNLOCK();
    if (bVar2) {
      if (_ZN4absl12lts_2025012712_GLOBAL__N_124synch_deadlock_detectionE_0 == 0) {
        return true;
      }
      id = GetGraphId(this);
      held_locks = Synch_GetAllLocks();
      LockEnter(this,id,held_locks);
      return true;
    }
  }
  else if ((uVar1 & 0x10) != 0) {
    bVar2 = TryLockSlow(this);
    return bVar2;
  }
  return false;
}

Assistant:

bool Mutex::TryLock() {
  ABSL_TSAN_MUTEX_PRE_LOCK(this, __tsan_mutex_try_lock);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  // Try fast acquire.
  if (ABSL_PREDICT_TRUE((v & (kMuWriter | kMuReader | kMuEvent)) == 0)) {
    if (ABSL_PREDICT_TRUE(mu_.compare_exchange_strong(
            v, kMuWriter | v, std::memory_order_acquire,
            std::memory_order_relaxed))) {
      DebugOnlyLockEnter(this);
      ABSL_TSAN_MUTEX_POST_LOCK(this, __tsan_mutex_try_lock, 0);
      return true;
    }
  } else if (ABSL_PREDICT_FALSE((v & kMuEvent) != 0)) {
    // We're recording events.
    return TryLockSlow();
  }
  ABSL_TSAN_MUTEX_POST_LOCK(
      this, __tsan_mutex_try_lock | __tsan_mutex_try_lock_failed, 0);
  return false;
}